

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>::grow
          (SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false> *this,size_t MinSize)

{
  bool bVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  NameIndex *Dest;
  iterator pNVar4;
  iterator pNVar5;
  NameIndex *NewElts;
  uint64_t local_20;
  size_t NewCapacity;
  size_t MinSize_local;
  SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false> *this_local;
  
  NewCapacity = MinSize;
  MinSize_local = (size_t)this;
  if (0xffffffff < MinSize) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  sVar2 = SmallVectorBase::capacity((SmallVectorBase *)this);
  local_20 = NextPowerOf2(sVar2 + 2);
  puVar3 = std::max<unsigned_long>(&local_20,&NewCapacity);
  NewElts = (NameIndex *)0xffffffff;
  puVar3 = std::min<unsigned_long>(puVar3,(unsigned_long *)&NewElts);
  local_20 = *puVar3;
  Dest = (NameIndex *)safe_malloc(local_20 * 0x98);
  pNVar4 = SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>::begin
                     (&this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>
                     );
  pNVar5 = SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>::end
                     (&this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>
                     );
  SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,false>::
  uninitialized_move<llvm::DWARFDebugNames::NameIndex*,llvm::DWARFDebugNames::NameIndex*>
            (pNVar4,pNVar5,Dest);
  pNVar4 = SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>::begin
                     (&this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>
                     );
  pNVar5 = SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>::end
                     (&this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>
                     );
  destroy_range(pNVar4,pNVar5);
  bVar1 = SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>::isSmall
                    (&this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>)
  ;
  if (!bVar1) {
    pNVar4 = SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>::begin
                       (&this->
                         super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>);
    free(pNVar4);
  }
  (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
  super_SmallVectorBase.BeginX = Dest;
  (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
  super_SmallVectorBase.Capacity = (uint)local_20;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}